

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void mkdir_cb(uv_fs_t *req)

{
  int iVar1;
  char *pcVar2;
  uv_fs_t *puVar3;
  uv_dirent_t dent;
  uv_fs_t *puStack_40;
  uint uStack_38;
  
  if (req == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00153b52;
    if (mkdir_req.result != 0) goto LAB_00153b57;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00153b5c;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    mkdir_cb_cold_1();
LAB_00153b52:
    mkdir_cb_cold_2();
LAB_00153b57:
    mkdir_cb_cold_3();
LAB_00153b5c:
    mkdir_cb_cold_5();
  }
  mkdir_cb_cold_4();
  if (req == &scandir_req) {
    puVar3 = req;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00153c6d;
    if (scandir_req.result != 2) goto LAB_00153c72;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00153c77;
    puVar3 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_40);
    req = puStack_40;
    while (iVar1 != -0xfff) {
      pcVar2 = "file1";
      puStack_40 = req;
      iVar1 = strcmp((char *)req,"file1");
      if (iVar1 != 0) {
        pcVar2 = "file2";
        iVar1 = strcmp((char *)req,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00153c68;
        }
      }
      dent.name = (char *)(ulong)uStack_38;
      dent._8_8_ = pcVar2;
      assert_is_file_type(dent);
      puVar3 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_40);
      req = puStack_40;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00153c7c;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00153c81;
    puVar3 = &scandir_req;
    uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_00153c68:
    scandir_cb_cold_1();
    puVar3 = req;
LAB_00153c6d:
    scandir_cb_cold_2();
LAB_00153c72:
    scandir_cb_cold_3();
LAB_00153c77:
    scandir_cb_cold_8();
LAB_00153c7c:
    scandir_cb_cold_7();
LAB_00153c81:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar3 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar3 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00153ce9;
    if (stat_req.result != 0) goto LAB_00153cee;
    if (stat_req.ptr == (void *)0x0) goto LAB_00153cf3;
    stat_cb_count = stat_cb_count + 1;
    puVar3 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00153ce9:
    stat_cb_cold_2();
LAB_00153cee:
    stat_cb_cold_3();
LAB_00153cf3:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar3 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00153d35;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00153d35:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar3 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00153d99;
    if (rmdir_req.result != 0) goto LAB_00153d9e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00153da8;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00153d99:
    rmdir_cb_cold_2();
LAB_00153d9e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00153da8:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void mkdir_cb(uv_fs_t* req) {
  ASSERT(req == &mkdir_req);
  ASSERT(req->fs_type == UV_FS_MKDIR);
  ASSERT(req->result == 0);
  mkdir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
}